

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O1

void __thiscall
btIDebugDraw::drawSpherePatch
          (btIDebugDraw *this,btVector3 *center,btVector3 *up,btVector3 *axis,btScalar radius,
          btScalar minTh,btScalar maxTh,btScalar minPs,btScalar maxPs,btVector3 *color,
          btScalar stepDegrees,bool drawCenter)

{
  btScalar *pbVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  long lVar7;
  undefined1 *puVar8;
  uint uVar9;
  int iVar10;
  undefined1 *puVar11;
  btVector3 *pbVar12;
  undefined1 *puVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btVector3 arcStart;
  btVector3 vB [74];
  btVector3 vA [74];
  bool local_a81;
  bool local_a80;
  btVector3 local_9a8;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [1184];
  undefined1 local_4d8 [1192];
  
  fVar2 = up->m_floats[0];
  fVar25 = (float)*(undefined8 *)(up->m_floats + 1);
  fVar27 = (float)((ulong)*(undefined8 *)(up->m_floats + 1) >> 0x20);
  fVar3 = axis->m_floats[0];
  local_988._4_4_ = fVar25 * radius + center->m_floats[1];
  local_988._0_4_ = fVar2 * radius + center->m_floats[0];
  local_988._8_4_ = fVar27 * radius + center->m_floats[2];
  local_988._12_4_ = 0;
  fVar24 = stepDegrees * 0.017453292;
  local_998._4_4_ = center->m_floats[1] - fVar25 * radius;
  local_998._0_4_ = center->m_floats[0] - fVar2 * radius;
  local_998._8_4_ = center->m_floats[2] - fVar27 * radius;
  local_998._12_4_ = 0;
  fVar18 = (float)*(undefined8 *)(axis->m_floats + 1);
  fVar22 = (float)((ulong)*(undefined8 *)(axis->m_floats + 1) >> 0x20);
  fVar26 = fVar24 + -1.5707964;
  if (minTh > -1.5707964) {
    fVar26 = minTh;
  }
  fVar28 = 1.5707964 - fVar24;
  if (1.5707964 > maxTh) {
    fVar28 = maxTh;
  }
  local_a81 = fVar28 < fVar26;
  if (local_a81) {
    fVar26 = fVar24 + -1.5707964;
    fVar28 = 1.5707964 - fVar24;
  }
  local_a80 = local_a81 || 1.5707964 <= maxTh;
  local_a81 = local_a81 || minTh <= -1.5707964;
  iVar10 = (int)((fVar28 - fVar26) / fVar24);
  if (iVar10 < 2) {
    iVar10 = 1;
  }
  fVar23 = maxPs - minPs;
  bVar5 = minPs <= maxPs;
  if (maxPs < minPs) {
    minPs = fVar24 + -3.1415927;
    maxPs = 3.1415927;
  }
  uVar9 = (uint)((maxPs - minPs) / fVar24);
  uVar6 = 1;
  if (1 < (int)uVar9) {
    uVar6 = (ulong)uVar9;
  }
  lVar7 = uVar6 * 0x10;
  puVar11 = local_4d8;
  puVar13 = local_978;
  iVar14 = 0;
  do {
    puVar8 = puVar11;
    fVar24 = (float)iVar14 * ((fVar28 - fVar26) / (float)iVar10) + fVar26;
    fVar19 = sinf(fVar24);
    fVar19 = fVar19 * radius;
    fVar24 = cosf(fVar24);
    iVar15 = 0;
    lVar16 = 0;
    do {
      fVar20 = (float)iVar15 * ((maxPs - minPs) / (float)(int)uVar6) + minPs;
      fVar21 = sinf(fVar20);
      fVar20 = cosf(fVar20);
      pbVar1 = (btScalar *)(puVar13 + lVar16);
      fVar21 = fVar21 * fVar24 * radius;
      fVar20 = fVar20 * fVar24 * radius;
      auVar4._4_4_ = (float)((ulong)*(undefined8 *)up->m_floats >> 0x20) * fVar19 +
                     fVar21 * (fVar27 * fVar3 - fVar22 * fVar2) +
                     (float)((ulong)*(undefined8 *)center->m_floats >> 0x20) +
                     fVar20 * (float)((ulong)*(undefined8 *)axis->m_floats >> 0x20);
      auVar4._0_4_ = (float)*(undefined8 *)up->m_floats * fVar19 +
                     fVar21 * (fVar25 * fVar22 - fVar18 * fVar27) +
                     (float)*(undefined8 *)center->m_floats +
                     fVar20 * (float)*(undefined8 *)axis->m_floats;
      auVar4._8_4_ = up->m_floats[2] * fVar19 +
                     axis->m_floats[2] * fVar20 + center->m_floats[2] +
                     (fVar2 * fVar18 - fVar3 * fVar25) * fVar21;
      auVar4._12_4_ = 0;
      *(undefined1 (*) [16])(puVar13 + lVar16) = auVar4;
      if (iVar14 == 0) {
        puVar11 = local_998;
        if (local_a80) goto LAB_00121b6e;
      }
      else {
        puVar11 = puVar8 + lVar16;
LAB_00121b6e:
        (*this->_vptr_btIDebugDraw[4])(this,puVar11,pbVar1,color);
      }
      if (lVar16 == 0) {
        local_9a8.m_floats[0] = *pbVar1;
        local_9a8.m_floats[1] = pbVar1[1];
        local_9a8.m_floats[2] = pbVar1[2];
        local_9a8.m_floats[3] = pbVar1[3];
      }
      else {
        (*this->_vptr_btIDebugDraw[4])(this,puVar13 + lVar16 + -0x10,pbVar1,color);
      }
      if (local_a81 && iVar14 == iVar10) {
        (*this->_vptr_btIDebugDraw[4])(this,local_988,pbVar1,color);
      }
      if (drawCenter) {
        if (bVar5 && fVar23 < 6.2831855) {
          pbVar12 = center;
          if ((lVar7 == lVar16 || lVar16 == 0) && (iVar14 == 0 || iVar14 == iVar10))
          goto LAB_00121c1a;
        }
        else {
          pbVar12 = &local_9a8;
          if (lVar7 == lVar16) {
LAB_00121c1a:
            (*this->_vptr_btIDebugDraw[4])(this,pbVar12,pbVar1,color);
          }
        }
      }
      lVar16 = lVar16 + 0x10;
      iVar15 = iVar15 + 1;
    } while (lVar7 + 0x10 != lVar16);
    bVar17 = iVar14 == iVar10;
    puVar11 = puVar13;
    puVar13 = puVar8;
    iVar14 = iVar14 + 1;
    if (bVar17) {
      return;
    }
  } while( true );
}

Assistant:

virtual void drawSpherePatch(const btVector3& center, const btVector3& up, const btVector3& axis, btScalar radius, 
		btScalar minTh, btScalar maxTh, btScalar minPs, btScalar maxPs, const btVector3& color, btScalar stepDegrees = btScalar(10.f),bool drawCenter = true)
	{
		btVector3 vA[74];
		btVector3 vB[74];
		btVector3 *pvA = vA, *pvB = vB, *pT;
		btVector3 npole = center + up * radius;
		btVector3 spole = center - up * radius;
		btVector3 arcStart;
		btScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		const btVector3& kv = up;
		const btVector3& iv = axis;
		btVector3 jv = kv.cross(iv);
		bool drawN = false;
		bool drawS = false;
		if(minTh <= -SIMD_HALF_PI)
		{
			minTh = -SIMD_HALF_PI + step;
			drawN = true;
		}
		if(maxTh >= SIMD_HALF_PI)
		{
			maxTh = SIMD_HALF_PI - step;
			drawS = true;
		}
		if(minTh > maxTh)
		{
			minTh = -SIMD_HALF_PI + step;
			maxTh =  SIMD_HALF_PI - step;
			drawN = drawS = true;
		}
		int n_hor = (int)((maxTh - minTh) / step) + 1;
		if(n_hor < 2) n_hor = 2;
		btScalar step_h = (maxTh - minTh) / btScalar(n_hor - 1);
		bool isClosed = false;
		if(minPs > maxPs)
		{
			minPs = -SIMD_PI + step;
			maxPs =  SIMD_PI;
			isClosed = true;
		}
		else if((maxPs - minPs) >= SIMD_PI * btScalar(2.f))
		{
			isClosed = true;
		}
		else
		{
			isClosed = false;
		}
		int n_vert = (int)((maxPs - minPs) / step) + 1;
		if(n_vert < 2) n_vert = 2;
		btScalar step_v = (maxPs - minPs) / btScalar(n_vert - 1);
		for(int i = 0; i < n_hor; i++)
		{
			btScalar th = minTh + btScalar(i) * step_h;
			btScalar sth = radius * btSin(th);
			btScalar cth = radius * btCos(th);
			for(int j = 0; j < n_vert; j++)
			{
				btScalar psi = minPs + btScalar(j) * step_v;
				btScalar sps = btSin(psi);
				btScalar cps = btCos(psi);
				pvB[j] = center + cth * cps * iv + cth * sps * jv + sth * kv;
				if(i)
				{
					drawLine(pvA[j], pvB[j], color);
				}
				else if(drawS)
				{
					drawLine(spole, pvB[j], color);
				}
				if(j)
				{
					drawLine(pvB[j-1], pvB[j], color);
				}
				else
				{
					arcStart = pvB[j];
				}
				if((i == (n_hor - 1)) && drawN)
				{
					drawLine(npole, pvB[j], color);
				}
				
				if (drawCenter)
				{
					if(isClosed)
					{
						if(j == (n_vert-1))
						{
							drawLine(arcStart, pvB[j], color);
						}
					}
					else
					{
						if(((!i) || (i == (n_hor-1))) && ((!j) || (j == (n_vert-1))))
						{
							drawLine(center, pvB[j], color);
						}
					}
				}
			}
			pT = pvA; pvA = pvB; pvB = pT;
		}
	}